

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void print_rdebug_grammar(Grammar *g,char *pathname)

{
  uint uVar1;
  uint uVar2;
  ElemKind EVar3;
  Declaration *pDVar4;
  Elem *pEVar5;
  Term *pTVar6;
  Production *pPVar7;
  Rule *pRVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  char *pcVar13;
  char *s;
  char **ppcVar14;
  char *pcVar15;
  Term *pTVar16;
  char *pcVar17;
  long lVar18;
  Code *pCVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  char ver [30];
  ulong local_88;
  char local_58 [40];
  
  d_version(local_58);
  printf("/*\n  Generated by Make DParser Version %s\n",local_58);
  puts("  Available at http://dparser.sf.net\n*/\n");
  printf("%%<");
  if (g->ncode != 0) {
    pCVar19 = g->code;
    bVar9 = true;
    lVar18 = 0;
    uVar21 = 0;
    do {
      printf("%s",*(undefined8 *)((long)&pCVar19->code + lVar18));
      pCVar19 = g->code;
      pcVar13 = strstr(*(char **)((long)&pCVar19->code + lVar18),"<stdio.h>");
      if (pcVar13 != (char *)0x0) {
        bVar9 = false;
      }
      uVar21 = uVar21 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar21 < g->ncode);
    if (!bVar9) goto LAB_0013c8a3;
  }
  puts("\n  #include <stdio.h>");
LAB_0013c8a3:
  printf("%%>\n\n");
  if (g->tokenizer != 0) {
    puts("${declare tokenize}");
  }
  if ((g->declarations).n != 0) {
    uVar21 = 0;
    do {
      pDVar4 = (g->declarations).v[uVar21];
      pEVar5 = pDVar4->elem;
      uVar1 = pDVar4->kind;
      if (uVar1 == 2) {
        if (g->longest_match == 0) {
          pcVar13 = "${declare all_matches}";
          goto LAB_0013c97c;
        }
        pcVar13 = ((pEVar5->e).nterm)->name;
        pcVar15 = "${declare all_matches %s}\n";
LAB_0013c96e:
        print_declare(pcVar15,pcVar13);
      }
      else if (uVar1 == 1) {
        if (g->longest_match == 0) {
          pcVar13 = ((pEVar5->e).nterm)->name;
          pcVar15 = "${declare longest_match %s}\n";
          goto LAB_0013c96e;
        }
        pcVar13 = "${declare longest_match}";
LAB_0013c97c:
        puts(pcVar13);
      }
      else {
        printf("\n/*\nDeclaration->kind: %d");
        printf("\nElem->kind:        %d\n*/\n",(ulong)pEVar5->kind);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (g->declarations).n);
  }
  if (g->set_op_priority_from_rule != 0) {
    puts("${declare set_op_priority_from_rule}");
  }
  if (g->states_for_all_nterms != 0) {
    puts("${declare all_subparsers}");
  }
  if (g->default_white_space != (char *)0x0) {
    printf("${declare whitespace %s}\n");
  }
  if (g->save_parse_tree != 0) {
    puts("${declare save_parse_tree}");
  }
  if ((g->scanner).code != (char *)0x0) {
    printf("${scanner %s}\n");
  }
  uVar2 = (g->terminals).n;
  uVar21 = (ulong)uVar2;
  if (uVar2 != 0) {
    bVar9 = true;
    uVar20 = 0;
    do {
      while (pTVar6 = (g->terminals).v[uVar20], pTVar6->kind != TERM_TOKEN) {
        uVar20 = uVar20 + 1;
        if (uVar21 <= uVar20) {
          if (bVar9) goto LAB_0013ca96;
          goto LAB_0013ca8a;
        }
      }
      pcVar13 = "";
      if (bVar9) {
        pcVar13 = "${token";
      }
      bVar9 = false;
      printf("%s %s",pcVar13,pTVar6->string);
      uVar21 = (ulong)(g->terminals).n;
      uVar20 = uVar20 + 1;
    } while (uVar20 < uVar21);
LAB_0013ca8a:
    puts("}");
  }
LAB_0013ca96:
  putchar(10);
  uVar1 = (g->productions).n;
  if (uVar1 == 0) {
    printf("/*\n  There were no productions in the grammar %s\n*/\n",pathname);
  }
  else if (uVar1 != 1) {
    uVar21 = 1;
    do {
      pPVar7 = (g->productions).v[uVar21];
      if ((pPVar7->rules).n != 0) {
        local_88 = 0;
        do {
          lVar18 = 0;
          bVar9 = true;
          bVar12 = false;
LAB_0013cafa:
          do {
            bVar11 = bVar12;
            bVar10 = bVar9;
            lVar22 = lVar18;
            pRVar8 = (pPVar7->rules).v[local_88];
            if ((local_88 == 0) || (!bVar10)) {
              printf("%s%s%s",*(undefined8 *)(&DAT_00150d90 + lVar22 * 8),pPVar7->name,
                     (&PTR_anon_var_dwarf_90e9_00150db0)[lVar22]);
            }
            else {
              printf("%s","\t|   ");
            }
            if ((pRVar8->elems).n != 0) {
              pcVar13 = "\\\"";
              if (bVar10) {
                pcVar13 = "\"";
              }
              pcVar15 = "#";
              if (bVar10) {
                pcVar15 = "$";
              }
              uVar20 = 0;
              do {
                pEVar5 = (pRVar8->elems).v[uVar20];
                EVar3 = pEVar5->kind;
                pTVar6 = (pEVar5->e).term;
                pTVar16 = pTVar6;
                if (EVar3 == ELEM_UNRESOLVED) {
LAB_0013cc4a:
                  printf("%s ",pTVar16);
                  goto LAB_0013cc51;
                }
                if (EVar3 != ELEM_TERM) {
                  pTVar16 = *(Term **)pTVar6;
                  goto LAB_0013cc4a;
                }
                pTVar16 = (Term *)pTVar6->term_name;
                if (pTVar16 != (Term *)0x0) goto LAB_0013cc4a;
                switch(pTVar6->kind) {
                case TERM_STRING:
                  if (pTVar6->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string_single_quote(pTVar6->string);
                    if ((pTVar6->string != (char *)0x0) && (*pTVar6->string != '\0')) {
                      pcVar17 = s;
                      if (!bVar10) {
                        pcVar17 = escape_string_single_quote(s);
                      }
                      printf("\'%s\' ",pcVar17);
                      goto LAB_0013cd0f;
                    }
                  }
                  printf("<EOF> ");
                  break;
                case TERM_REGEX:
                  if (pTVar6->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar6->string);
                  }
                  pcVar17 = s;
                  if (!bVar10) {
                    pcVar17 = escape_string(s);
                  }
                  printf("%s%s%s ",pcVar13,pcVar17);
LAB_0013cd0f:
                  if ((pTVar6->field_0x2c & 8) != 0) {
                    printf("/i ");
                  }
                  if (pTVar6->term_priority != 0) {
                    printf("%sterm %d ",pcVar15);
                  }
                  break;
                case TERM_CODE:
                  if (pTVar6->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar6->string);
                  }
                  pcVar17 = "code(\"%s\") ";
                  goto LAB_0013ccc2;
                case TERM_TOKEN:
                  if (pTVar6->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar6->string);
                  }
                  pcVar17 = "%s ";
LAB_0013ccc2:
                  printf(pcVar17,s);
                  break;
                default:
                  d_fail("unknown token kind");
                  goto LAB_0013cc51;
                }
                if (s != (char *)0x0) {
                  free(s);
                }
LAB_0013cc51:
                uVar20 = uVar20 + 1;
              } while (uVar20 < (pRVar8->elems).n);
            }
            if (pRVar8->op_assoc != ASSOC_NONE) {
              lVar18 = 0;
              do {
                if (*(AssocKind *)((long)&assoc_strings[0].e + lVar18) == pRVar8->op_assoc) {
                  ppcVar14 = (char **)((long)&assoc_strings[0].s + lVar18);
                  goto LAB_0013cd92;
                }
                lVar18 = lVar18 + 0x10;
              } while (lVar18 != 0x80);
              ppcVar14 = &assoc_strings[0].s;
LAB_0013cd92:
              printf(" %s%s ",*(undefined8 *)(&DAT_00150dd0 + lVar22 * 8),*ppcVar14 + 1);
            }
            if (pRVar8->op_priority != 0) {
              printf("%d ");
            }
            if (pRVar8->rule_assoc != ASSOC_NONE) {
              lVar18 = 0;
              do {
                if (*(AssocKind *)((long)&assoc_strings[0].e + lVar18) == pRVar8->rule_assoc) {
                  ppcVar14 = (char **)((long)&assoc_strings[0].s + lVar18);
                  goto LAB_0013ce01;
                }
                lVar18 = lVar18 + 0x10;
              } while (lVar18 != 0x80);
              ppcVar14 = &assoc_strings[0].s;
LAB_0013ce01:
              printf(" %s%s ",*(undefined8 *)(&DAT_00150dd0 + lVar22 * 8),*ppcVar14 + 1);
            }
            if (pRVar8->rule_priority != 0) {
              printf("%d ");
            }
            lVar18 = 1;
            bVar9 = false;
            bVar12 = true;
          } while (((bool)(bVar10 & d_rdebug_grammar_level == 1)) ||
                  (bVar9 = false, (bool)(bVar10 & d_rdebug_grammar_level == 3)));
          if ((bool)(d_rdebug_grammar_level == 3 & bVar11 | bVar10 & d_rdebug_grammar_level == 2)) {
            lVar18 = 2;
            bVar9 = false;
            bVar12 = false;
            if (bVar11) {
              printf("%s","\\n\"); ]");
              bVar9 = false;
              bVar12 = false;
            }
            goto LAB_0013cafa;
          }
          printf("%s",&DAT_0014a3b0 + *(int *)(&DAT_0014a3b0 + lVar22 * 4));
          local_88 = local_88 + 1;
        } while (local_88 < (pPVar7->rules).n);
      }
      puts("\t;");
      putchar(10);
      uVar21 = uVar21 + 1;
    } while (uVar21 < (g->productions).n);
  }
  return;
}

Assistant:

void print_rdebug_grammar(Grammar *g, char *pathname) {
  char ver[30];
  d_version(ver);

  printf("/*\n  Generated by Make DParser Version %s\n", ver);
  printf("  Available at http://dparser.sf.net\n*/\n\n");

  print_global_code(g);
  print_declarations(g);
  print_productions(g, pathname);
}